

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_disrupt_vision(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  bVar1 = is_affected_by((CHAR_DATA *)vo,0);
  if (!bVar1) {
    bVar1 = saves_spell(level,(CHAR_DATA *)vo,0xb);
    if (((!bVar1) && ((*(byte *)((long)vo + 0x181) & 0x40) == 0)) &&
       ((*(byte *)((long)vo + 0x281) & 1) == 0)) {
      init_affect(&AStack_98);
      AStack_98.where = 0;
      AStack_98.aftype = get_spell_aftype(ch);
      AStack_98.type = (short)sn;
      AStack_98.location = 0;
      AStack_98.modifier = 0;
      AStack_98.duration =
           (short)((uint)(level / 6 + (level >> 0x1f)) >> 1) - (short)(level >> 0x1f);
      AStack_98.bitvector[0]._0_1_ = (byte)AStack_98.bitvector[0] | 1;
      AStack_98.mod_name = 0;
      AStack_98.level = (short)level;
      affect_to_char((CHAR_DATA *)vo,&AStack_98);
      send_to_char("A white flash blankets your field of vision, and you cannot see anything!\n\r",
                   (CHAR_DATA *)vo);
      act("$n appears to be blinded.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      return;
    }
  }
  send_to_char("Spell failed.\n\r",ch);
  send_to_char("Slight flickering briefly obscures your vision but then subsides.\n\r",
               (CHAR_DATA *)vo);
  return;
}

Assistant:

void spell_disrupt_vision(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected_by(victim, AFF_BLIND)
		|| saves_spell(level, victim, DAM_ENERGY)
		|| IS_SET(victim->act, ACT_UNDEAD)
		|| IS_SET(victim->form, FORM_UNDEAD))
	{
		send_to_char("Spell failed.\n\r", ch);
		send_to_char("Slight flickering briefly obscures your vision but then subsides.\n\r", victim);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 12;

	SET_BIT(af.bitvector, AFF_BLIND);

	af.mod_name = MOD_VISION;
	affect_to_char(victim, &af);

	send_to_char("A white flash blankets your field of vision, and you cannot see anything!\n\r", victim);
	act("$n appears to be blinded.", victim, nullptr, nullptr, TO_ROOM);
}